

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void slu_PrintInt10(char *name,int len,int *x)

{
  ulong uVar1;
  
  printf("%10s:",name);
  if (0 < len) {
    uVar1 = 0;
    do {
      if ((int)uVar1 == (int)((uVar1 & 0xffffffff) / 10) * 10) {
        printf("\n\t[%2d-%2d]",uVar1 & 0xffffffff,(ulong)((int)uVar1 + 9));
      }
      printf("%6d",(ulong)(uint)x[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void slu_PrintInt10(const char *name, int len, const int *x)
{
    register int i;
    
    printf("%10s:", name);
    for (i = 0; i < len; ++i)
    {
	if ( i % 10 == 0 ) printf("\n\t[%2d-%2d]", i, i + 9);
	printf("%6d", x[i]);
    }
    printf("\n");
}